

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O1

int m256v_row_iszero(m256v *M,int r)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = (ulong)M->n_col;
  bVar5 = (long)uVar2 < 1;
  if (0 < (long)uVar2) {
    lVar3 = (long)r * M->rstride;
    if (M->e[lVar3] == '\0') {
      uVar1 = 1;
      do {
        uVar4 = uVar1;
        if (uVar2 == uVar4) break;
        uVar1 = uVar4 + 1;
      } while (M->e[uVar4 + lVar3] == '\0');
      bVar5 = uVar2 <= uVar4;
    }
  }
  return (int)bVar5;
}

Assistant:

int m256v_row_iszero(const m256v* M, int r)
{
	for (int c = 0; c < M->n_col; ++c) {
		if (get_el(M, r, c) != 0) {
			return 0;
		}
	}
	return 1;
}